

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_xml_repeat_tests.cpp
# Opt level: O0

void __thiscall
iu_TestF_x_iutest_x_XmlFilePath_Test::Body(iu_TestF_x_iutest_x_XmlFilePath_Test *this)

{
  bool bVar1;
  TestEventListeners *this_00;
  DefaultXmlGeneratorListener *this_01;
  string *val1;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionHelper local_308;
  Fixed local_2d8;
  undefined1 local_140 [8];
  AssertionResult iutest_ar;
  char expect [256];
  iu_TestF_x_iutest_x_XmlFilePath_Test *this_local;
  
  iutest::detail::iu_snprintf(&iutest_ar.m_result,0x100,"test_%d.xml",(ulong)(uint)TestF::nI);
  iutest::detail::AlwaysZero();
  this_00 = iutest::TestEnv::event_listeners();
  this_01 = (DefaultXmlGeneratorListener *)
            iutest::TestEventListeners::default_xml_generator(this_00);
  val1 = iutest::DefaultXmlGeneratorListener::GetFilePath_abi_cxx11_(this_01);
  iutest::internal::backward::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            ((AssertionResult *)local_140,(EqHelper<false> *)"expect",
             "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(::iutest::TestEnv::event_listeners().default_xml_generator())->GetFilePath())"
             ,&iutest_ar.m_result,(char (*) [256])val1,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    memset(&local_2d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2d8);
    message = iutest::AssertionResult::message((AssertionResult *)local_140);
    iutest::AssertionHelper::AssertionHelper
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_xml_repeat_tests.cpp"
               ,0x30,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_308,&local_2d8);
    iutest::AssertionHelper::~AssertionHelper(&local_308);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  return;
}

Assistant:

IUTEST_F(TestF, XmlFilePath)
{
    char expect[256];
    ::iutest::detail::iu_snprintf(expect, sizeof(expect), "test_%d.xml", nI);
    IUTEST_ASSERT_EQ( expect
        , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(::iutest::TestEnv::event_listeners().default_xml_generator())->GetFilePath()) );
}